

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddBezierCurve
          (ImDrawList *this,ImVec2 *pos0,ImVec2 *cp0,ImVec2 *cp1,ImVec2 *pos1,ImU32 col,
          float thickness,int num_segments)

{
  int iVar1;
  int iVar2;
  ImVec2 *pIVar3;
  ImVec2 *__dest;
  int iVar4;
  ImVec2 *pIVar5;
  
  if (0xffffff < col) {
    iVar2 = (this->_Path).Size;
    if (iVar2 == (this->_Path).Capacity) {
      if (iVar2 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar2 / 2 + iVar2;
      }
      iVar1 = iVar2 + 1;
      if (iVar2 + 1 < iVar4) {
        iVar1 = iVar4;
      }
      pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar1 << 3);
      pIVar5 = (this->_Path).Data;
      if (pIVar5 == (ImVec2 *)0x0) {
        pIVar5 = (ImVec2 *)0x0;
      }
      else {
        memcpy(pIVar3,pIVar5,(long)(this->_Path).Size << 3);
        pIVar5 = (this->_Path).Data;
      }
      ImGui::MemFree(pIVar5);
      (this->_Path).Data = pIVar3;
      (this->_Path).Capacity = iVar1;
      iVar2 = (this->_Path).Size;
    }
    else {
      pIVar3 = (this->_Path).Data;
    }
    (this->_Path).Size = iVar2 + 1;
    pIVar3[iVar2] = *pos0;
    PathBezierCurveTo(this,cp0,cp1,pos1,num_segments);
    AddPolyline(this,(this->_Path).Data,(this->_Path).Size,col,false,thickness,true);
    if ((this->_Path).Capacity < 0) {
      pIVar5 = (ImVec2 *)0x0;
      __dest = (ImVec2 *)ImGui::MemAlloc(0);
      pIVar3 = (this->_Path).Data;
      if (pIVar3 != (ImVec2 *)0x0) {
        memcpy(__dest,pIVar3,(long)(this->_Path).Size << 3);
        pIVar5 = (this->_Path).Data;
      }
      ImGui::MemFree(pIVar5);
      (this->_Path).Data = __dest;
      (this->_Path).Capacity = 0;
    }
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddBezierCurve(const ImVec2& pos0, const ImVec2& cp0, const ImVec2& cp1, const ImVec2& pos1, ImU32 col, float thickness, int num_segments)
{
    if ((col >> 24) == 0)
        return;

    PathLineTo(pos0);
    PathBezierCurveTo(cp0, cp1, pos1, num_segments);
    PathStroke(col, false, thickness);
}